

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

void __thiscall RenX_ModSystemPlugin::~RenX_ModSystemPlugin(RenX_ModSystemPlugin *this)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  long *plVar8;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  *(undefined ***)this = &PTR_think_00119428;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00119908;
  uVar3 = RenX::getCore();
  lVar4 = RenX::Core::getServerCount();
  while (lVar4 != 0) {
    lVar4 = lVar4 + -1;
    lVar5 = RenX::Core::getServer(uVar3);
    lVar1 = *(long *)(lVar5 + 0x20);
    lVar6 = RenX::Server::getBotCount();
    if (lVar1 != lVar6) {
      plVar8 = (long *)(lVar5 + 0x10);
      while (plVar8 = (long *)*plVar8, plVar8 != (long *)(lVar5 + 0x10)) {
        if (*(char *)(plVar8 + 0x22) == '\0') {
          uVar7 = Jupiter::Config::operator[]
                            (plVar8 + 0x39,*(undefined8 *)&this->field_0x20,
                             *(undefined8 *)&this->field_0x18);
          Jupiter::Config::remove(uVar7,5,"Group");
          plVar8[0x31] = 0;
          *(undefined1 *)plVar8[0x30] = 0;
          plVar8[0x35] = 0;
          *(undefined1 *)plVar8[0x34] = 0;
          __x._M_str = "administrator";
          __x._M_len = 0xd;
          __y._M_str = (char *)plVar8[0xb];
          __y._M_len = plVar8[0xc];
          bVar2 = std::operator==(__x,__y);
          if (bVar2) {
            *(undefined4 *)(plVar8 + 0x38) = 2;
          }
          else {
            __x_00._M_str = "moderator";
            __x_00._M_len = 9;
            __y_00._M_str = (char *)plVar8[0xb];
            __y_00._M_len = plVar8[0xc];
            bVar2 = std::operator==(__x_00,__y_00);
            if (bVar2) {
              *(undefined4 *)(plVar8 + 0x38) = 1;
            }
            else {
              *(undefined4 *)(plVar8 + 0x38) = 0;
            }
          }
        }
      }
    }
  }
  std::__cxx11::
  list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::clear
            (&this->groups);
  std::__cxx11::string::~string((string *)&this->m_administratorGroup);
  std::__cxx11::string::~string((string *)&this->m_moderatorGroup);
  std::__cxx11::string::~string((string *)&this->m_atmDefault);
  std::__cxx11::
  _List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::
  _M_clear(&(this->groups).
            super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
          );
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ModSystemPlugin::~RenX_ModSystemPlugin() {
	RenX::Core *core = RenX::getCore();
	size_t server_count = core->getServerCount();
	RenX::Server *server;
	while (server_count != 0) {
		server = core->getServer(--server_count);
		if (server->players.size() != server->getBotCount()) {
			for (auto node = server->players.begin(); node != server->players.end(); ++node) {
				if (node->isBot == false) {
					node->varData[RenX_ModSystemPlugin::name].remove("Group"sv);
					node->gamePrefix.clear();
					node->formatNamePrefix.clear();
					if (node->adminType == game_administrator_name)
						node->access = 2;
					else if (node->adminType == game_moderator_name)
						node->access = 1;
					else
						node->access = 0;
				}
			}
		}
	}

	RenX_ModSystemPlugin::groups.clear();
}